

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkShaderModuleCreateInfo *
Fossilize::find_pnext<VkShaderModuleCreateInfo>(VkStructureType sType,void *pNext)

{
  VkShaderModuleCreateInfo *pVVar1;
  undefined4 in_register_0000003c;
  
  for (pVVar1 = (VkShaderModuleCreateInfo *)CONCAT44(in_register_0000003c,sType);
      (pVVar1 != (VkShaderModuleCreateInfo *)0x0 &&
      (pVVar1->sType != VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO));
      pVVar1 = (VkShaderModuleCreateInfo *)pVVar1->pNext) {
  }
  return pVVar1;
}

Assistant:

static const T *find_pnext(VkStructureType sType, const void *pNext)
{
	while (pNext)
	{
		auto *base_in = static_cast<const VkBaseInStructure *>(pNext);
		if (base_in->sType == sType)
			return static_cast<const T *>(pNext);
		pNext = base_in->pNext;
	}
	return nullptr;
}